

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.h
# Opt level: O2

void __thiscall
jrtplib::RTPUDPv4TransmissionInfo::~RTPUDPv4TransmissionInfo(RTPUDPv4TransmissionInfo *this)

{
  ~RTPUDPv4TransmissionInfo(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~RTPUDPv4TransmissionInfo()								{ }